

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int ptls_receive(ptls_t *tls,ptls_buffer_t *decryptbuf,void *_input,size_t *inlen)

{
  uint8_t *puVar1;
  uint64_t *puVar2;
  ulong uVar3;
  st_ptls_aead_context_t *psVar4;
  char cVar5;
  byte bVar11;
  byte bVar15;
  short sVar17;
  ushort uVar18;
  short sVar19;
  undefined1 auVar20 [12];
  short sVar21;
  short sVar22;
  ptls_buffer_t *ppVar23;
  uint8_t *puVar24;
  uint8_t uVar25;
  int iVar26;
  st_ptls_aead_algorithm_t *psVar27;
  size_t sVar28;
  uint8_t *end;
  ulong uVar29;
  short sVar30;
  ulong uVar31;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 uVar33;
  undefined1 auVar32 [16];
  ulong uVar34;
  undefined4 uVar35;
  undefined1 auVar36 [16];
  ulong uVar37;
  undefined1 auVar38 [14];
  ulong uVar39;
  ulong uVar40;
  size_t consumed;
  uint64_t nonce;
  uint8_t *src;
  st_ptls_record_t rec;
  ulong local_90;
  uint8_t local_88;
  undefined2 local_87;
  undefined1 local_85;
  undefined1 local_84;
  size_t local_80;
  size_t *local_78;
  uint64_t local_70;
  uint8_t *local_68;
  size_t local_60;
  ptls_buffer_t *local_58;
  size_t local_50;
  st_ptls_record_t local_48;
  byte bVar6;
  char cVar7;
  byte bVar8;
  char cVar9;
  char cVar10;
  byte bVar12;
  char cVar13;
  char cVar14;
  byte bVar16;
  
  if (tls->state < PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
    __assert_fail("tls->state >= PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x17c7,"int ptls_receive(ptls_t *, ptls_buffer_t *, const void *, size_t *)");
  }
  puVar1 = (uint8_t *)((long)_input + *inlen);
  local_78 = inlen;
  if (*inlen == 0) {
    sVar28 = 0;
    iVar26 = 0;
  }
  else {
    sVar28 = decryptbuf->off;
    local_58 = &(tls->recvbuf).rec;
    local_50 = sVar28;
    while (sVar28 == decryptbuf->off) {
      local_80 = (long)puVar1 - (long)_input;
      if (((tls->traffic_protection).dec.field_0x58 & 1) == 0) {
        iVar26 = handle_input(tls,(ptls_message_emitter_t *)0x0,decryptbuf,_input,&local_80,
                              (ptls_handshake_properties_t *)0x0);
      }
      else {
        iVar26 = parse_record(tls,&local_48,(uint8_t *)_input,&local_80);
        if (iVar26 == 0) {
          if (local_48.fragment == (uint8_t *)0x0) {
            __assert_fail("rec.fragment != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                          ,0x1743,
                          "int handle_input_tls12(ptls_t *, ptls_buffer_t *, const void *, size_t *)"
                         );
          }
          local_68 = local_48.fragment;
          end = local_48.fragment + local_48.length;
          psVar27 = ((tls->traffic_protection).dec.aead)->algo;
          sVar28 = (psVar27->tls12).record_iv_size;
          if (sVar28 == 0) {
            local_70 = (tls->traffic_protection).dec.seq;
            uVar33 = extraout_XMM0_Qb;
LAB_001138af:
            uVar25 = local_48.type;
            puVar24 = local_68;
            uVar29 = (long)end - (long)local_68;
            sVar28 = uVar29 - psVar27->tag_size;
            if (psVar27->tag_size <= uVar29) {
              uVar3 = (tls->traffic_protection).dec.seq;
              uVar35 = (undefined4)(uVar3 >> 0x20);
              auVar20._4_8_ = uVar33;
              auVar20._0_4_ = uVar35;
              auVar32._0_8_ = auVar20._0_8_ << 0x20;
              auVar32._8_4_ = (int)uVar3;
              auVar32._12_4_ = uVar35;
              auVar36._0_8_ = uVar3 >> 8;
              auVar36._8_8_ = uVar3;
              uVar39 = auVar32._8_8_;
              auVar36 = auVar36 & _DAT_0012ac40;
              uVar37 = (ulong)DAT_0012ac40;
              uVar31 = uVar3 >> 0x18 & uVar37;
              uVar40 = DAT_0012ac40._8_8_;
              uVar34 = uVar39 >> 0x10 & uVar40;
              sVar17 = (short)uVar31;
              cVar5 = (0 < sVar17) * (sVar17 < 0x100) * (char)uVar31 - (0xff < sVar17);
              sVar17 = (short)(uVar31 >> 0x10);
              sVar30 = CONCAT11((0 < sVar17) * (sVar17 < 0x100) * (char)(uVar31 >> 0x10) -
                                (0xff < sVar17),cVar5);
              uVar18 = (ushort)(uVar31 >> 0x20);
              bVar6 = (uVar18 != 0) * (uVar18 < 0x100) * (char)(uVar31 >> 0x20) - (0xff < uVar18);
              sVar17 = (short)uVar34;
              cVar7 = (0 < sVar17) * (sVar17 < 0x100) * (char)uVar34 - (0xff < sVar17);
              sVar17 = (short)(uVar34 >> 0x10);
              sVar21 = CONCAT11((0 < sVar17) * (sVar17 < 0x100) * (char)(uVar34 >> 0x10) -
                                (0xff < sVar17),cVar7);
              sVar17 = (short)(uVar34 >> 0x20);
              bVar8 = (0 < sVar17) * (sVar17 < 0x100) * (char)(uVar34 >> 0x20) - (0xff < sVar17);
              sVar17 = auVar36._0_2_;
              cVar9 = (0 < sVar17) * (sVar17 < 0x100) * auVar36[0] - (0xff < sVar17);
              sVar17 = auVar36._2_2_;
              sVar22 = CONCAT11((0 < sVar17) * (sVar17 < 0x100) * auVar36[2] - (0xff < sVar17),cVar9
                               );
              sVar17 = auVar36._4_2_;
              cVar10 = (0 < sVar17) * (sVar17 < 0x100) * auVar36[4] - (0xff < sVar17);
              sVar19 = auVar36._6_2_;
              uVar31 = uVar3 >> 0x28 & uVar37;
              uVar34 = uVar39 >> 0x20 & uVar40;
              uVar37 = uVar3 >> 0x38 & uVar37;
              uVar40 = uVar39 >> 0x30 & uVar40;
              uVar18 = (ushort)uVar37;
              bVar11 = (uVar18 != 0) * (uVar18 < 0x100) * (char)uVar37 - (0xff < uVar18);
              sVar17 = (short)uVar40;
              bVar12 = (0 < sVar17) * (sVar17 < 0x100) * (char)uVar40 - (0xff < sVar17);
              sVar17 = (short)uVar31;
              cVar13 = (0 < sVar17) * (sVar17 < 0x100) * (char)uVar31 - (0xff < sVar17);
              uVar18 = (ushort)(uVar31 >> 0x10);
              uVar18 = CONCAT11((uVar18 != 0) * (uVar18 < 0x100) * (char)(uVar31 >> 0x10) -
                                (0xff < uVar18),cVar13);
              auVar38._0_12_ = ZEXT212(uVar18) << 0x40;
              sVar17 = (short)uVar34;
              cVar14 = (0 < sVar17) * (sVar17 < 0x100) * (char)uVar34 - (0xff < sVar17);
              auVar38[0xc] = cVar14;
              sVar17 = (short)(uVar34 >> 0x10);
              auVar38[0xd] = (0 < sVar17) * (sVar17 < 0x100) * (char)(uVar34 >> 0x10) -
                             (0xff < sVar17);
              bVar11 = (bVar11 != 0) * (bVar11 < 0x100) * bVar11 - (0xff < bVar11);
              bVar12 = (bVar12 != 0) * (bVar12 < 0x100) * bVar12 - (0xff < bVar12);
              bVar15 = (0 < (short)uVar18) * ((short)uVar18 < 0x100) * cVar13 -
                       (0xff < (short)uVar18);
              sVar17 = auVar38._12_2_;
              bVar16 = (0 < sVar17) * (sVar17 < 0x100) * cVar14 - (0xff < sVar17);
              cVar5 = (0 < sVar30) * (sVar30 < 0x100) * cVar5 - (0xff < sVar30);
              sVar30 = CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),cVar5);
              cVar7 = (0 < sVar21) * (sVar21 < 0x100) * cVar7 - (0xff < sVar21);
              uVar35 = CONCAT13((bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8),
                                CONCAT12(cVar7,sVar30));
              cVar9 = (0 < sVar22) * (sVar22 < 0x100) * cVar9 - (0xff < sVar22);
              sVar19 = (short)(CONCAT13((0 < sVar19) * (sVar19 < 0x100) * auVar36[6] -
                                        (0xff < sVar19),CONCAT12(cVar10,sVar22)) >> 0x10);
              sVar17 = (short)((uint)uVar35 >> 0x10);
              sVar19 = (short)(CONCAT15((0 < sVar19) * (sVar19 < 0x100) * cVar10 - (0xff < sVar19),
                                        CONCAT14(cVar9,uVar35)) >> 0x20);
              local_90 = (ulong)CONCAT16((0 < sVar19) * (sVar19 < 0x100) * cVar9 - (0xff < sVar19),
                                         CONCAT15((0 < sVar17) * (sVar17 < 0x100) * cVar7 -
                                                  (0xff < sVar17),
                                                  CONCAT14((0 < sVar30) * (sVar30 < 0x100) * cVar5 -
                                                           (0xff < sVar30),
                                                           CONCAT13((bVar16 != 0) * (bVar16 < 0x100)
                                                                    * bVar16 - (0xff < bVar16),
                                                                    CONCAT12((bVar15 != 0) *
                                                                             (bVar15 < 0x100) *
                                                                             bVar15 - (0xff < bVar15
                                                                                      ),
                                                                             CONCAT11((bVar12 != 0)
                                                                                      * (bVar12 < 
                                                  0x100) * bVar12 - (0xff < bVar12),
                                                  (bVar11 != 0) * (bVar11 < 0x100) * bVar11 -
                                                  (0xff < bVar11)))))));
              local_88 = local_48.type;
              local_87 = 0x303;
              local_85 = (undefined1)(sVar28 >> 8);
              local_84 = (undefined1)sVar28;
              local_60 = sVar28;
              iVar26 = ptls_buffer_reserve_aligned(decryptbuf,sVar28,'\0');
              if (((iVar26 == 0) &&
                  (psVar4 = (tls->traffic_protection).dec.aead,
                  sVar28 = (*psVar4->do_decrypt)
                                     (psVar4,decryptbuf->base + decryptbuf->off,puVar24,uVar29,
                                      local_70,&local_90,0xd), sVar28 == local_60)) &&
                 (puVar2 = &(tls->traffic_protection).dec.seq, *puVar2 = *puVar2 + 1,
                 uVar25 == '\x17')) {
                decryptbuf->off = decryptbuf->off + local_60;
              }
            }
          }
          else {
            if (sVar28 != 8) {
              __assert_fail("tls->traffic_protection.dec.aead->algo->tls12.record_iv_size == 8",
                            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                            ,0x174b,
                            "int handle_input_tls12(ptls_t *, ptls_buffer_t *, const void *, size_t *)"
                           );
            }
            iVar26 = ptls_decode64(&local_70,&local_68,end);
            if (iVar26 == 0) {
              psVar27 = ((tls->traffic_protection).dec.aead)->algo;
              uVar33 = extraout_XMM0_Qb_00;
              goto LAB_001138af;
            }
          }
          ppVar23 = local_58;
          ptls_buffer__release_memory(local_58);
          ppVar23->off = 0;
          ppVar23->is_allocated = '\0';
          ppVar23->align_bits = '\0';
          *(undefined6 *)&ppVar23->field_0x1a = 0;
          ppVar23->base = (uint8_t *)0x0;
          ppVar23->capacity = 0;
          (*ptls_clear_memory)(&local_90,0xd);
          iVar26 = 0;
          sVar28 = local_50;
        }
      }
      _input = (void *)((long)_input + local_80);
      if (iVar26 == 0x202) {
        iVar26 = 0;
      }
      if ((iVar26 != 0) || ((uint8_t *)_input == puVar1)) goto LAB_00113a1a;
    }
    iVar26 = 0;
LAB_00113a1a:
    sVar28 = *local_78;
  }
  *local_78 = (size_t)((long)_input + (sVar28 - (long)puVar1));
  return iVar26;
}

Assistant:

int ptls_receive(ptls_t *tls, ptls_buffer_t *decryptbuf, const void *_input, size_t *inlen)
{
    const uint8_t *input = (const uint8_t *)_input, *const end = input + *inlen;
    size_t decryptbuf_orig_size = decryptbuf->off;
    int ret = 0;

    assert(tls->state >= PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA);

    /* loop until we decrypt some application data (or an error) */
    while (ret == 0 && input != end && decryptbuf_orig_size == decryptbuf->off) {
        size_t consumed = end - input;
        if (tls->traffic_protection.dec.tls12) {
            ret = handle_input_tls12(tls, decryptbuf, input, &consumed);
        } else {
            ret = handle_input(tls, NULL, decryptbuf, input, &consumed, NULL);
        }
        input += consumed;

        switch (ret) {
        case 0:
            break;
        case PTLS_ERROR_IN_PROGRESS:
            ret = 0;
            break;
        case PTLS_ERROR_CLASS_PEER_ALERT + PTLS_ALERT_CLOSE_NOTIFY:
            /* TODO send close alert */
            break;
        default:
            if (PTLS_ERROR_GET_CLASS(ret) == PTLS_ERROR_CLASS_SELF_ALERT) {
                /* TODO send alert */
            }
            break;
        }
    }

    *inlen -= end - input;

    return ret;
}